

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int lws_parse_numeric_address(char *ads,uint8_t *result,size_t max_len)

{
  char cVar1;
  size_t sVar2;
  uint8_t *puVar3;
  lws_tokenize_elem lVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  uint8_t *puVar8;
  int iVar9;
  int iVar10;
  uint8_t *puVar11;
  int iVar12;
  bool bVar13;
  char t [5];
  lws_tokenize ts;
  uint8_t temp [16];
  char local_9d [5];
  ulong local_98;
  size_t local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  long local_78;
  lws_tokenize local_70;
  undefined1 local_48 [24];
  
  local_90 = max_len;
  local_88 = result;
  pcVar5 = strchr(ads,0x3a);
  bVar13 = pcVar5 != (char *)0x0;
  lws_tokenize_init(&local_70,ads,0x41);
  local_70.len = strlen(ads);
  puVar11 = local_88;
  sVar2 = local_90;
  iVar9 = -1;
  if ((((6 < local_70.len || bVar13) && (iVar9 = -2, pcVar5 == (char *)0x0 || 1 < local_70.len)) &&
      (iVar9 = -3, 3 < local_90 || pcVar5 != (char *)0x0)) &&
     (iVar9 = -4, 0xf < local_90 || pcVar5 == (char *)0x0)) {
    if (pcVar5 != (char *)0x0) {
      memset(local_88,0,local_90);
    }
    local_80 = puVar11 + 0xc;
    local_78 = (long)(int)sVar2;
    iVar10 = -1;
    local_98 = 0;
    iVar9 = 0;
    puVar8 = puVar11;
    do {
      lVar4 = lws_tokenize(&local_70);
      sVar2 = local_70.token_len;
      puVar3 = local_88;
      local_70.e = (int8_t)lVar4;
      iVar12 = (int)puVar11;
      if (local_70.e == '\x01') {
        if (iVar9 == 0) {
          if (bVar13) {
            if (((puVar11[2] != 0xff) || (puVar11[3] != 0xff)) || (iVar10 != 2)) {
              bVar13 = true;
              iVar9 = 1;
              if (*local_70.token != ':') {
                return -10;
              }
              goto LAB_00112833;
            }
            local_98 = 0;
            memset(puVar11,0,local_90);
            puVar11[10] = 0xff;
            puVar11[0xb] = 0xff;
            iVar10 = -1;
            puVar8 = local_80;
          }
          else if (*local_70.token != '.') {
            return -0xb;
          }
          iVar9 = 1;
          bVar13 = false;
        }
        else {
          if (1 < iVar9) {
            return -8;
          }
          if (*local_70.token != ':') {
            return -9;
          }
          iVar9 = iVar9 + 1;
          puVar8[0] = '\0';
          puVar8[1] = '\0';
          puVar8 = puVar8 + 2;
          iVar10 = (int)puVar8 - iVar12;
        }
      }
      else {
        if (local_70.e != '\x02') {
          if (local_70.e != '\0') {
            _lws_log(1,"%s: malformed ip address\n","lws_parse_numeric_address");
            return -0xd;
          }
          if (((int)local_98 == 4 && !bVar13) || ((int)local_98 == 8 && bVar13)) {
            return (int)puVar8 - iVar12;
          }
          if (iVar10 == -1) {
            return -0xc;
          }
          iVar12 = (int)puVar8 - iVar12;
          if (iVar12 == 0x10) {
            return 0x10;
          }
          puVar11 = local_88 + iVar10;
          iVar12 = iVar12 - iVar10;
          memcpy(local_48,puVar11,(long)iVar12);
          memset(puVar11,0,(long)(0x10 - iVar10));
          memcpy(puVar3 + (0x10 - iVar12),local_48,(long)iVar12);
          return 0x10;
        }
        if (bVar13) {
          if (4 < local_70.token_len) {
            return -1;
          }
          memcpy(local_9d,local_70.token,local_70.token_len);
          local_9d[sVar2] = '\0';
          if (sVar2 != 0) {
            uVar6 = 0;
            do {
              cVar1 = local_9d[uVar6];
              if ((byte)(cVar1 + 0x99U) < 0xc9) {
                return -1;
              }
              if ((byte)(cVar1 - 0x3aU) < 7) {
                return -1;
              }
              if ((byte)(cVar1 + 0xb9U) < 0x1a) {
                return -1;
              }
              uVar6 = uVar6 + 1;
            } while (sVar2 != uVar6);
          }
          lVar7 = strtol(local_9d,(char **)0x0,0x10);
          if (0xffff < lVar7) {
            return -5;
          }
          *puVar8 = (uint8_t)((ulong)lVar7 >> 8);
          puVar8 = puVar8 + 1;
        }
        else {
          if (3 < local_70.token_len) {
            return -1;
          }
          memcpy(local_9d,local_70.token,local_70.token_len);
          local_9d[sVar2] = '\0';
          if (sVar2 != 0) {
            uVar6 = 0;
            do {
              if ((byte)(local_9d[uVar6] - 0x3aU) < 0xf6) {
                return -1;
              }
              uVar6 = uVar6 + 1;
            } while (sVar2 != uVar6);
          }
          lVar7 = strtol(local_9d,(char **)0x0,10);
          if (0xff < lVar7) {
            return -6;
          }
        }
        if (lVar7 < 0) {
          return -7;
        }
        *puVar8 = (uint8_t)lVar7;
        puVar8 = puVar8 + 1;
        local_98 = (ulong)((int)local_98 + 1);
        iVar9 = 0;
      }
LAB_00112833:
    } while (('\0' < local_70.e) && ((long)puVar8 - (long)puVar11 <= local_78));
    _lws_log(1,"%s: ended on e %d\n","lws_parse_numeric_address");
    iVar9 = -0xe;
  }
  return iVar9;
}

Assistant:

int
lws_parse_numeric_address(const char *ads, uint8_t *result, size_t max_len)
{
	struct lws_tokenize ts;
	uint8_t *orig = result, temp[16];
	int sects = 0, ipv6 = !!strchr(ads, ':'), skip_point = -1, dm = 0;
	char t[5];
	size_t n;
	long u;

	lws_tokenize_init(&ts, ads, LWS_TOKENIZE_F_NO_INTEGERS |
				    LWS_TOKENIZE_F_MINUS_NONTERM);
	ts.len = strlen(ads);
	if (!ipv6 && ts.len < 7)
		return -1;

	if (ipv6 && ts.len < 2)
		return -2;

	if (!ipv6 && max_len < 4)
		return -3;

	if (ipv6 && max_len < 16)
		return -4;

	if (ipv6)
		memset(result, 0, max_len);

	do {
		ts.e = lws_tokenize(&ts);
		switch (ts.e) {
		case LWS_TOKZE_TOKEN:
			dm = 0;
			if (ipv6) {
				if (ts.token_len > 4)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > 'f' ||
					    (t[n] > '9' && t[n] < 'A') ||
					    (t[n] > 'F' && t[n] < 'a'))
						return -1;
				u = strtol(t, NULL, 16);
				if (u > 0xffff)
					return -5;
				*result++ = (uint8_t)(u >> 8);
			} else {
				if (ts.token_len > 3)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > '9')
						return -1;
				u = strtol(t, NULL, 10);
				if (u > 0xff)
					return -6;
			}
			if (u < 0)
				return -7;
			*result++ = (uint8_t)u;
			sects++;
			break;

		case LWS_TOKZE_DELIMITER:
			if (dm++) {
				if (dm > 2)
					return -8;
				if (*ts.token != ':')
					return -9;
				/* back to back : */
				*result++ = 0;
				*result++ = 0;
				skip_point = lws_ptr_diff(result, orig);
				break;
			}
			if (ipv6 && orig[2] == 0xff && orig[3] == 0xff &&
			    skip_point == 2) {
				/* ipv4 backwards compatible format */
				ipv6 = 0;
				memset(orig, 0, max_len);
				orig[10] = 0xff;
				orig[11] = 0xff;
				skip_point = -1;
				result = &orig[12];
				sects = 0;
				break;
			}
			if (ipv6 && *ts.token != ':')
				return -10;
			if (!ipv6 && *ts.token != '.')
				return -11;
			break;

		case LWS_TOKZE_ENDED:
			if (!ipv6 && sects == 4)
				return lws_ptr_diff(result, orig);
			if (ipv6 && sects == 8)
				return lws_ptr_diff(result, orig);
			if (skip_point != -1) {
				int ow = lws_ptr_diff(result, orig);
				/*
				 * contains ...::...
				 */
				if (ow == 16)
					return 16;
				memcpy(temp, &orig[skip_point], ow - skip_point);
				memset(&orig[skip_point], 0, 16 - skip_point);
				memcpy(&orig[16 - (ow - skip_point)], temp,
						   ow - skip_point);

				return 16;
			}
			return -12;

		default: /* includes ENDED */
			lwsl_err("%s: malformed ip address\n",
				 __func__);

			return -13;
		}
	} while (ts.e > 0 && result - orig <= (int)max_len);

	lwsl_err("%s: ended on e %d\n", __func__, ts.e);

	return -14;
}